

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void DefaultFormatter::
     Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *t)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
            (s,(long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  puVar2 = (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    s->m_substream->nSize = (size_t)(puVar3 + (s->m_substream->nSize - (long)puVar2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Ser(Stream& s, const T& t) { Serialize(s, t); }